

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::write_significand<fmt::v8::appender,char,char_const*>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  appender aVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> out_00;
  long lVar2;
  ulong uVar3;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  if ((grouping->sep_).thousands_sep == '\0') {
    out_00.container =
         (buffer<char> *)
         copy_str_noinline<char,char_const*,fmt::v8::appender>
                   (significand,significand + integral_size,out);
    if (decimal_point != '\0') {
      lVar2 = *(long *)((long)out_00.container + 0x10);
      uVar3 = lVar2 + 1;
      if (*(ulong *)((long)out_00.container + 0x18) < uVar3) {
        (*(code *)**(undefined8 **)out_00.container)(out_00.container);
        lVar2 = *(long *)((long)out_00.container + 0x10);
        uVar3 = lVar2 + 1;
      }
      *(ulong *)((long)out_00.container + 0x10) = uVar3;
      *(char *)(*(long *)((long)out_00.container + 8) + lVar2) = decimal_point;
      aVar1 = copy_str_noinline<char,char_const*,fmt::v8::appender>
                        (significand + integral_size,significand + significand_size,
                         (appender)out_00.container);
      return (appender)aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
  }
  else {
    local_240 = local_228;
    local_238 = 0;
    local_248 = &PTR_grow_001e6068;
    local_230 = 500;
    aVar1 = copy_str_noinline<char,char_const*,fmt::v8::appender>
                      (significand,significand + integral_size,(appender)&local_248);
    if (decimal_point != '\0') {
      lVar2 = *(long *)((long)aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar3 = lVar2 + 1;
      if (*(ulong *)((long)aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                           container + 0x18) < uVar3) {
        (*(code *)**(undefined8 **)
                    aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                  (aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                container + 0x10);
        uVar3 = lVar2 + 1;
      }
      *(ulong *)((long)aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x10) = uVar3;
      *(char *)(*(long *)((long)aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                container + 8) + lVar2) = decimal_point;
      copy_str_noinline<char,char_const*,fmt::v8::appender>
                (significand + integral_size,significand + significand_size,aVar1);
    }
    if (integral_size < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/core.h"
                  ,0x182,"negative value");
    }
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_240;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v8::appender,char>(grouping,out,digits);
    out_00.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v8::appender>
                   (local_240 + integral_size,local_240 + local_238,out);
    if (local_240 != local_228) {
      operator_delete(local_240,local_230);
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)out_00.container;
}

Assistant:

inline auto write_significand(OutputIt out, T significand, int significand_size,
                              int integral_size, Char decimal_point,
                              const digit_grouping<Char>& grouping)
    -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}